

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void ipred_plane_uv(pel *src,pel *dst,int i_dst,int w,int h,int bit_depth)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  long lVar6;
  int temp2_u;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  pel pVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  
  lVar6 = (long)w;
  lVar15 = (long)h;
  pbVar5 = src + lVar6 + -1;
  iVar17 = 0;
  lVar9 = -0x200000000;
  lVar11 = 0x200000000;
  iVar20 = 0;
  for (lVar8 = 1; lVar8 <= w >> 1; lVar8 = lVar8 + 1) {
    iVar20 = iVar20 + ((uint)src[(lVar11 >> 0x20) + lVar6] - (uint)src[(lVar9 >> 0x20) + lVar6]) *
                      (int)lVar8;
    iVar17 = iVar17 + ((uint)src[(lVar11 >> 0x20) + lVar6 + 1] - (uint)*pbVar5) * (int)lVar8;
    pbVar5 = pbVar5 + -2;
    lVar11 = lVar11 + 0x200000000;
    lVar9 = lVar9 + -0x200000000;
  }
  iVar10 = 0;
  iVar4 = 3;
  lVar9 = -0x100000000;
  lVar8 = -0x200000000;
  lVar19 = 0x200000000;
  iVar13 = 0;
  for (lVar11 = 1; lVar11 <= h >> 1; lVar11 = lVar11 + 1) {
    iVar13 = iVar13 + ((uint)src[(lVar8 >> 0x20) - lVar15] - (uint)src[(lVar19 >> 0x20) - lVar15]) *
                      (int)lVar11;
    iVar10 = iVar10 + ((uint)src[(lVar9 >> 0x20) - lVar15] - (uint)src[iVar4 - lVar15]) *
                      (int)lVar11;
    iVar4 = iVar4 + 2;
    lVar9 = lVar9 + -0x200000000;
    lVar19 = lVar19 + 0x200000000;
    lVar8 = lVar8 + -0x200000000;
  }
  lVar8 = (long)(w * 2);
  bVar2 = (byte)*(undefined4 *)(&DAT_00179a48 + (long)g_tbl_log2[lVar6] * 4);
  iVar4 = 1 << (bVar2 - 1 & 0x1f);
  iVar21 = iVar20 * *(int *)(&DAT_00179a28 + (long)g_tbl_log2[lVar6] * 4) * 0x20 + iVar4 >>
           (bVar2 & 0x1f);
  bVar3 = (byte)*(undefined4 *)(&DAT_00179a48 + (long)g_tbl_log2[lVar15] * 4);
  iVar20 = 1 << (bVar3 - 1 & 0x1f);
  iVar14 = iVar13 * *(int *)(&DAT_00179a28 + (long)g_tbl_log2[lVar15] * 4) * 0x20 + iVar20 >>
           (bVar3 & 0x1f);
  iVar22 = (h >> 1) + -1;
  iVar13 = (w >> 1) + -1;
  uVar16 = ~(-1 << ((byte)bit_depth & 0x1f));
  iVar4 = *(int *)(&DAT_00179a28 + (long)g_tbl_log2[lVar6] * 4) * 0x20 * iVar17 + iVar4 >>
          (bVar2 & 0x1f);
  iVar10 = *(int *)(&DAT_00179a28 + (long)g_tbl_log2[lVar15] * 4) * 0x20 * iVar10 + iVar20 >>
           (bVar3 & 0x1f);
  iVar20 = (((uint)src[lVar8] + (uint)src[h * -2]) * 0x10 - (iVar14 * iVar22 + iVar21 * iVar13)) +
           0x10;
  iVar17 = (((uint)src[lVar8 + 1] + (uint)src[(long)(h * -2) + 1]) * 0x10 -
           (iVar22 * iVar10 + iVar13 * iVar4)) + 0x10;
  if (h < 1) {
    h = 0;
  }
  for (iVar13 = 0; iVar13 != h; iVar13 = iVar13 + 1) {
    iVar22 = iVar20;
    iVar7 = iVar17;
    for (lVar6 = 0; lVar6 < lVar8; lVar6 = lVar6 + 2) {
      uVar18 = iVar22 >> 5;
      uVar23 = iVar7 >> 5;
      iVar22 = iVar22 + iVar21;
      iVar7 = iVar7 + iVar4;
      uVar1 = uVar16;
      if ((int)uVar18 < (int)uVar16) {
        uVar1 = uVar18;
      }
      pVar12 = (pel)uVar1;
      if ((int)uVar18 < 0) {
        pVar12 = '\0';
      }
      dst[lVar6] = pVar12;
      uVar1 = uVar16;
      if ((int)uVar23 < (int)uVar16) {
        uVar1 = uVar23;
      }
      pVar12 = (pel)uVar1;
      if ((int)uVar23 < 0) {
        pVar12 = '\0';
      }
      dst[lVar6 + 1] = pVar12;
    }
    iVar20 = iVar20 + iVar14;
    iVar17 = iVar17 + iVar10;
    dst = dst + i_dst;
  }
  return;
}

Assistant:

void ipred_plane_uv(pel *src, pel *dst, int i_dst, int w, int h, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    pel *rsrc;
    int  coef_hor_u = 0, coef_ver_u = 0;
    int  coef_hor_v = 0, coef_ver_v = 0;
    int  a_u, b_u, c_u, a_v, b_v, c_v, x, y;
    int  w2 = w >> 1;
    int  h2 = h >> 1;
    int  width2  = w << 1;
    int  height2 = h << 1;
    int  ib_mult[5] = { 13, 17, 5, 11, 23 };
    int  ib_shift[5] = { 7, 10, 11, 15, 19 };
    int  idx_w = g_tbl_log2[w] - 2;
    int  idx_h = g_tbl_log2[h] - 2;
    int  im_h, is_h, im_v, is_v;
    int  temp_u, temp_v;
    int  max_pel = (1 << bit_depth) - 1;
    int  val_u, val_v;

    im_h = ib_mult[idx_w];
    is_h = ib_shift[idx_w];
    im_v = ib_mult[idx_h];
    is_v = ib_shift[idx_h];
    rsrc = src + w;
    for (x = 1; x < w2 + 1; x++)
    {
        int x2 = x << 1;
        coef_hor_u += x * (rsrc[x2] - rsrc[-x2]);
        coef_hor_v += x * (rsrc[x2 + 1] - rsrc[-x2 + 1]);
    }
    rsrc = src - h;
    for (y = 1; y < h2 + 1; y++)
    {
        int y2 = y << 1;
        coef_ver_u += y * (rsrc[-y2] - rsrc[y2]);
        coef_ver_v += y * (rsrc[-y2 + 1] - rsrc[y2 + 1]);
    }
    a_u = (src[-height2] + src[width2]) << 4;
    b_u = ((coef_hor_u << 5) * im_h + (1 << (is_h - 1))) >> is_h;
    c_u = ((coef_ver_u << 5) * im_v + (1 << (is_v - 1))) >> is_v;
    a_v = (src[-height2 + 1] + src[width2 + 1]) << 4;
    b_v = ((coef_hor_v << 5) * im_h + (1 << (is_h - 1))) >> is_h;
    c_v = ((coef_ver_v << 5) * im_v + (1 << (is_v - 1))) >> is_v;
    temp_u = a_u - (h2 - 1) * c_u - (w2 - 1) * b_u + 16;
    temp_v = a_v - (h2 - 1) * c_v - (w2 - 1) * b_v + 16;

    for (y = 0; y < h; y++) {
        int temp2_u = temp_u;
        int temp2_v = temp_v;
        for (x = 0; x < width2; x += 2) {
            val_u = temp2_u >> 5;
            val_v = temp2_v >> 5;
            temp2_u += b_u;
            temp2_v += b_v;
            dst[x    ] = COM_CLIP3(0, max_pel, val_u);
            dst[x + 1] = COM_CLIP3(0, max_pel, val_v);
        }
        temp_u += c_u;
        temp_v += c_v;
        dst += i_dst;
    }
}